

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

int HTS_fseek(HTS_File *fp,long offset,int origin)

{
  void *pvVar1;
  int iVar2;
  
  if (fp == (HTS_File *)0x0) {
    return 1;
  }
  if (fp->type != '\x01') {
    if (fp->type == '\0') {
      iVar2 = fseek((FILE *)fp->pointer,offset,origin);
      return iVar2;
    }
    HTS_error(0,"HTS_fseek: Unknown file type.\n");
    return 1;
  }
  pvVar1 = fp->pointer;
  if (origin == 2) {
    offset = offset + *(long *)((long)pvVar1 + 8);
  }
  else {
    if (origin == 1) {
      *(long *)((long)pvVar1 + 0x10) = *(long *)((long)pvVar1 + 0x10) + offset;
      return 0;
    }
    if (origin != 0) {
      return 1;
    }
  }
  *(long *)((long)pvVar1 + 0x10) = offset;
  return 0;
}

Assistant:

int HTS_fseek(HTS_File * fp, long offset, int origin)
{
   if (fp == NULL) {
      return 1;
   } else if (fp->type == HTS_FILE) {
      return fseek((FILE *) fp->pointer, offset, origin);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      if (origin == SEEK_SET) {
         d->index = (size_t) offset;
      } else if (origin == SEEK_CUR) {
         d->index += offset;
      } else if (origin == SEEK_END) {
         d->index = d->size + offset;
      } else {
         return 1;
      }
      return 0;
   }
   HTS_error(0, "HTS_fseek: Unknown file type.\n");
   return 1;
}